

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_table_scan.cpp
# Opt level: O1

void __thiscall
duckdb::TableScanLocalSourceState::TableScanLocalSourceState
          (TableScanLocalSourceState *this,ExecutionContext *context,
          TableScanGlobalSourceState *gstate,PhysicalTableScan *op)

{
  _Head_base<0UL,_duckdb::FunctionData_*,_false> bind_data_p;
  _Head_base<0UL,_duckdb::LocalTableFunctionState_*,_false> _Var1;
  undefined8 uVar2;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::TableFilterSet_*,_false> filters_p;
  TableFunctionInitInput input;
  undefined1 local_a8 [32];
  TableFunctionInitInput local_88;
  
  (this->super_LocalSourceState)._vptr_LocalSourceState =
       (_func_int **)&PTR__TableScanLocalSourceState_024a8d68;
  (this->local_state).
  super_unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LocalTableFunctionState_*,_std::default_delete<duckdb::LocalTableFunctionState>_>
  .super__Head_base<0UL,_duckdb::LocalTableFunctionState_*,_false>._M_head_impl =
       (LocalTableFunctionState *)0x0;
  if ((op->function).init_local != (table_function_init_local_t)0x0) {
    bind_data_p._M_head_impl =
         (op->bind_data).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::vector
              ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)(local_a8 + 8),
               &(op->column_ids).
                super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
    filters_p._M_head_impl =
         (gstate->table_filters).
         super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
         .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl;
    if (filters_p._M_head_impl == (TableFilterSet *)0x0) {
      filters_p._M_head_impl =
           (op->table_filters).
           super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
           .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl;
    }
    TableFunctionInitInput::TableFunctionInitInput
              (&local_88,(optional_ptr<const_duckdb::FunctionData,_true>)bind_data_p._M_head_impl,
               (vector<duckdb::ColumnIndex,_true> *)(local_a8 + 8),&op->projection_ids,
               (optional_ptr<duckdb::TableFilterSet,_true>)filters_p._M_head_impl,
               (optional_ptr<duckdb::SampleOptions,_true>)
               (op->extra_info).sample_options.
               super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>.
               _M_t.
               super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
               .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl);
    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
              ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)(local_a8 + 8));
    (*(op->function).init_local)
              ((ExecutionContext *)local_a8,(TableFunctionInitInput *)context,
               (GlobalTableFunctionState *)&local_88);
    uVar2 = local_a8._0_8_;
    local_a8._0_8_ = (ClientContext *)0x0;
    _Var1._M_head_impl =
         (this->local_state).
         super_unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LocalTableFunctionState_*,_std::default_delete<duckdb::LocalTableFunctionState>_>
         .super__Head_base<0UL,_duckdb::LocalTableFunctionState_*,_false>._M_head_impl;
    (this->local_state).
    super_unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::LocalTableFunctionState_*,_std::default_delete<duckdb::LocalTableFunctionState>_>
    .super__Head_base<0UL,_duckdb::LocalTableFunctionState_*,_false>._M_head_impl =
         (LocalTableFunctionState *)uVar2;
    if (_Var1._M_head_impl != (LocalTableFunctionState *)0x0) {
      (*(_Var1._M_head_impl)->_vptr_LocalTableFunctionState[1])();
    }
    if ((ClientContext *)local_a8._0_8_ != (ClientContext *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_a8._0_8_)->__weak_this_)
                  .internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)();
    }
    if (local_88.projection_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.projection_ids.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
              (&local_88.column_indexes.
                super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
    if (local_88.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.column_ids.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

TableScanLocalSourceState(ExecutionContext &context, TableScanGlobalSourceState &gstate,
	                          const PhysicalTableScan &op) {
		if (op.function.init_local) {
			TableFunctionInitInput input(op.bind_data.get(), op.column_ids, op.projection_ids,
			                             gstate.GetTableFilters(op), op.extra_info.sample_options);
			local_state = op.function.init_local(context, input, gstate.global_state.get());
		}
	}